

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherCWrapper.cpp
# Opt level: O3

efsw_watchid
efsw_addwatch_withoptions
          (efsw_watcher watcher,char *directory,efsw_pfn_fileaction_callback callback_fn,
          int recursive,efsw_watcher_option *options,int options_number,void *param)

{
  pointer __position;
  pointer ppWVar1;
  WatchID WVar2;
  ulong uVar3;
  allocator local_89;
  Watcher_CAPI *local_88;
  int local_7c;
  vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> local_78;
  char *local_58;
  string local_50;
  
  __position = g_callbacks.super__Vector_base<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  for (ppWVar1 = g_callbacks.super__Vector_base<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; local_7c = recursive,
      local_58 = directory,
      ppWVar1 !=
      g_callbacks.super__Vector_base<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppWVar1 = ppWVar1 + 1) {
    local_88 = *ppWVar1;
    if (((local_88->mFn == callback_fn) && (local_88->mWatcher == watcher)) &&
       (local_88->mParam == param)) goto LAB_0011b35d;
  }
  local_88 = (Watcher_CAPI *)operator_new(0x20);
  (local_88->super_FileWatchListener)._vptr_FileWatchListener =
       (_func_int **)&PTR__FileWatchListener_0012f9f0;
  local_88->mWatcher = watcher;
  local_88->mFn = callback_fn;
  local_88->mParam = param;
  if (__position ==
      g_callbacks.super__Vector_base<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Watcher_CAPI*,std::allocator<Watcher_CAPI*>>::_M_realloc_insert<Watcher_CAPI*const&>
              ((vector<Watcher_CAPI*,std::allocator<Watcher_CAPI*>> *)&g_callbacks,
               (iterator)__position,&local_88);
  }
  else {
    *__position = local_88;
    g_callbacks.super__Vector_base<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_callbacks.super__Vector_base<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
LAB_0011b35d:
  local_78.super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>._M_impl.
  super__Vector_impl_data._M_finish = (WatcherOption *)0x0;
  local_78.super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (WatcherOption *)0x0;
  if (0 < options_number) {
    uVar3 = 0;
    do {
      local_50._M_dataplus._M_p = *(pointer *)(options + uVar3);
      if (local_78.super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_78.super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>::
        _M_realloc_insert<efsw::WatcherOption>
                  (&local_78,
                   (iterator)
                   local_78.
                   super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(WatcherOption *)&local_50);
      }
      else {
        *local_78.super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>.
         _M_impl.super__Vector_impl_data._M_finish = (WatcherOption)local_50._M_dataplus._M_p;
        local_78.super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)options_number != uVar3);
  }
  std::__cxx11::string::string((string *)&local_50,local_58,&local_89);
  WVar2 = efsw::FileWatcher::addWatch
                    ((FileWatcher *)watcher,&local_50,&local_88->super_FileWatchListener,
                     local_7c != 0,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_78.super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return WVar2;
}

Assistant:

efsw_watchid  efsw_addwatch_withoptions(efsw_watcher watcher, const char* directory,
										efsw_pfn_fileaction_callback callback_fn, int recursive,
										efsw_watcher_option *options, int options_number,
										void* param) {
	Watcher_CAPI* callback = find_callback( watcher, callback_fn, param );

	if ( callback == NULL ) {
		callback = new Watcher_CAPI( watcher, callback_fn, param );
		g_callbacks.push_back( callback );
	}

	std::vector<efsw::WatcherOption> watcher_options{};
	for ( int i = 0; i < options_number; i++ ) {
		efsw_watcher_option* option = &options[i];
		watcher_options.emplace_back( efsw::WatcherOption{
			static_cast<efsw::Option>(option->option), option->value } );
	}

	return ( (efsw::FileWatcher*)watcher )
		->addWatch( std::string( directory ), callback, TOBOOL( recursive ), watcher_options );
}